

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReverseLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reverse(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3c0) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3c0;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    ReverseLayerParams::ReverseLayerParams(this_00.reverse_);
    (this->layer_).reverse_ = (ReverseLayerParams *)this_00;
  }
  return (ReverseLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReverseLayerParams* NeuralNetworkLayer::mutable_reverse() {
  if (!has_reverse()) {
    clear_layer();
    set_has_reverse();
    layer_.reverse_ = new ::CoreML::Specification::ReverseLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reverse)
  return layer_.reverse_;
}